

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_ClassArray<ON_FontFaceQuartet> * __thiscall ON_FontList::QuartetList(ON_FontList *this)

{
  Member MVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint k1;
  long lVar6;
  undefined1 *puVar7;
  wchar_t *quartet_name_00;
  int pair_dex;
  uint uVar8;
  int iVar9;
  ON_Font **ppOVar10;
  uint uVar11;
  long *plVar12;
  ON_wString *pOVar13;
  ON_Font *pOVar14;
  uint pass;
  uint uVar15;
  int iVar16;
  size_t new_capacity;
  ulong uVar17;
  ulong uVar18;
  ON_SimpleArray<const_ON_Font_*> *this_00;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ON_FontListImpl *pOVar24;
  uint j;
  ulong uVar25;
  ulong uVar26;
  ON_3udex OVar27;
  ON_wString quartet_name;
  ON_FontFaceQuartet q;
  ON_SimpleArray<const_ON_Font_*> bolditalic_faces;
  ON_SimpleArray<const_ON_Font_*> italic_faces;
  ON_SimpleArray<const_ON_Font_*> bold_faces;
  ON_SimpleArray<const_ON_Font_*> regular_faces;
  uint weight_count [10] [2];
  ON_Font *slanted_faces [2];
  ON_Font *upright_faces [2];
  ON_Font *fonts_by_ssw [11] [2] [11];
  ON_Font *local_958;
  ON_FontListImpl *local_950;
  ulong local_948;
  long local_940;
  ON_Font *local_938 [4];
  uint local_918;
  uint local_914;
  ulong local_910;
  ulong local_908;
  ulong local_900;
  ON_wString local_8f8;
  ulong local_8f0;
  ON_ClassArray<ON_FontFaceQuartet> *local_8e8;
  uint local_8dc;
  ON_FontFaceQuartet local_8d8;
  ulong local_8b0;
  ON_SimpleArray<const_ON_Font_*> local_8a8;
  ON_SimpleArray<const_ON_Font_*> local_890;
  ON_SimpleArray<const_ON_Font_*> local_878;
  ON_SimpleArray<const_ON_Font_*> local_860;
  uint local_848 [22];
  ON_wString local_7f0;
  ON_Font *local_7e8 [4];
  long local_7c8 [4];
  long alStack_7a8 [239];
  
  Internal_UpdateSortedLists(this);
  local_8e8 = &this->m_quartet_list;
  if ((this->m_quartet_list).m_count < 1) {
    pOVar24 = this->m_sorted;
    uVar15 = (pOVar24->m_by_quartet_name).m_count;
    new_capacity = (ulong)(uVar15 >> 2) + 0x20;
    if ((uint)(this->m_quartet_list).m_capacity < (uint)new_capacity) {
      ON_ClassArray<ON_FontFaceQuartet>::SetCapacity(local_8e8,new_capacity);
    }
    local_958 = (ON_Font *)0x0;
    memset(local_7c8,0,0x790);
    local_848[0x10] = 0;
    local_848[0x11] = 0;
    local_848[0x12] = 0;
    local_848[0x13] = 0;
    local_848[0xc] = 0;
    local_848[0xd] = 0;
    local_848[0xe] = 0;
    local_848[0xf] = 0;
    local_848[8] = 0;
    local_848[9] = 0;
    local_848[10] = 0;
    local_848[0xb] = 0;
    local_848[4] = 0;
    local_848[5] = 0;
    local_848[6] = 0;
    local_848[7] = 0;
    local_848[0] = 0;
    local_848[1] = 0;
    local_848[2] = 0;
    local_848[3] = 0;
    local_860._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081e920;
    local_860.m_a = (ON_Font **)0x0;
    local_860.m_count = 0;
    local_860.m_capacity = 0;
    ON_SimpleArray<const_ON_Font_*>::SetCapacity(&local_860,8);
    local_878._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081e920;
    local_878.m_a = (ON_Font **)0x0;
    local_878.m_count = 0;
    local_878.m_capacity = 0;
    ON_SimpleArray<const_ON_Font_*>::SetCapacity(&local_878,8);
    local_890._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081e920;
    local_890.m_a = (ON_Font **)0x0;
    local_890.m_count = 0;
    local_890.m_capacity = 0;
    ON_SimpleArray<const_ON_Font_*>::SetCapacity(&local_890,8);
    local_8a8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081e920;
    local_8a8.m_a = (ON_Font **)0x0;
    local_8a8.m_count = 0;
    local_8a8.m_capacity = 0;
    ON_SimpleArray<const_ON_Font_*>::SetCapacity(&local_8a8,8);
    if (uVar15 != 0) {
      uVar23 = 0;
      uVar25 = 0;
      local_950 = pOVar24;
      local_8dc = uVar15;
      do {
        pOVar14 = (pOVar24->m_by_quartet_name).m_a[uVar25];
        local_958 = pOVar14;
        local_8b0 = uVar25;
        if (pOVar14 != (ON_Font *)0x0) {
          local_900 = uVar25;
          bVar5 = ON_wString::IsNotEmpty(&pOVar14->m_loc_windows_logfont_name);
          pOVar13 = &pOVar14->m_en_windows_logfont_name;
          if (bVar5) {
            pOVar13 = &pOVar14->m_loc_windows_logfont_name;
          }
          ON_wString::ON_wString(&local_8f8,pOVar13);
          bVar5 = ON_wString::IsEmpty(&local_8f8);
          if (!bVar5) {
            memset(local_7c8,0,0x790);
            local_848[0] = 0;
            local_848[1] = 0;
            local_848[2] = 0;
            local_848[3] = 0;
            local_848[4] = 0;
            local_848[5] = 0;
            local_848[6] = 0;
            local_848[7] = 0;
            local_848[8] = 0;
            local_848[9] = 0;
            local_848[10] = 0;
            local_848[0xb] = 0;
            local_848[0xc] = 0;
            local_848[0xd] = 0;
            local_848[0xe] = 0;
            local_848[0xf] = 0;
            local_848[0x10] = 0;
            local_848[0x11] = 0;
            local_848[0x12] = 0;
            local_848[0x13] = 0;
            if (-1 < (long)local_860._16_8_) {
              local_860._16_8_ = local_860._16_8_ & 0xffffffff00000000;
            }
            if (-1 < (long)local_878._16_8_) {
              local_878._16_8_ = local_878._16_8_ & 0xffffffff00000000;
            }
            if (-1 < (long)local_890._16_8_) {
              local_890._16_8_ = local_890._16_8_ & 0xffffffff00000000;
            }
            if (-1 < (long)local_8a8._16_8_) {
              local_8a8._16_8_ = local_8a8._16_8_ & 0xffffffff00000000;
            }
            local_7e8[2] = (ON_Font *)0x0;
            local_7e8[3] = (ON_Font *)0x0;
            local_7e8[0] = (ON_Font *)0x0;
            local_7e8[1] = (ON_Font *)0x0;
            local_940 = CONCAT44(local_940._4_4_,1);
            uVar25 = local_900 & 0xffffffff;
            if ((uint)local_900 < uVar15) {
              local_940 = CONCAT44(local_940._4_4_,1);
              uVar25 = local_8b0;
              do {
                pOVar14 = (pOVar24->m_by_quartet_name).m_a[uVar25];
                pOVar24 = local_950;
                local_958 = pOVar14;
                if (pOVar14 == (ON_Font *)0x0) goto LAB_0048300c;
                pOVar13 = &pOVar14->m_loc_windows_logfont_name;
                bVar5 = ON_wString::IsNotEmpty(pOVar13);
                if (!bVar5) {
                  pOVar13 = &pOVar14->m_en_windows_logfont_name;
                }
                ON_wString::ON_wString(&local_8d8.m_quartet_name,pOVar13);
                bVar5 = ON_wString::EqualOrdinal(&local_8f8,&local_8d8.m_quartet_name,true);
                ON_wString::~ON_wString(&local_8d8.m_quartet_name);
                pOVar24 = local_950;
                if (!bVar5) goto LAB_0048300c;
                uVar8 = (uint)local_958->m_managed_installed_font_and_bits & 3;
                if (uVar8 != 2) {
                  uVar8 = (uint)local_940;
                }
                uVar11 = (uint)local_940;
                if (local_958->m_runtime_serial_number != 0) {
                  uVar11 = uVar8;
                }
                local_940 = CONCAT44(local_940._4_4_,uVar11);
                uVar25 = uVar25 + 1;
              } while (uVar15 != (uint)uVar25);
              uVar25 = (ulong)uVar15;
            }
LAB_0048300c:
            uVar26 = local_8b0;
            local_8f0 = uVar25;
            uVar25 = uVar25 & 0xffffffff;
            local_948 = 0;
            local_910 = local_910 & 0xffffffff00000000;
            local_908 = local_908 & 0xffffffff00000000;
            iVar22 = 0;
            local_914 = 0;
            local_918 = 0;
            uVar15 = 0;
            do {
              uVar23 = uVar26;
              if ((uint)local_900 < (uint)local_8f0) {
                do {
                  local_958 = (pOVar24->m_by_quartet_name).m_a[uVar23];
                  if (local_958 != (ON_Font *)0x0) {
                    if ((local_958->m_font_bUnderlined == false) &&
                       (local_958->m_font_bStrikethrough != true)) {
                      if (uVar15 == (((uint)local_958->m_managed_installed_font_and_bits & 3) == 2
                                    && local_958->m_runtime_serial_number != 0)) {
                        MVar1 = local_958->m_quartet_member;
                        OVar27 = Internal_StretchSlantWeightDex(10,10,local_958);
                        uVar11 = OVar27.k;
                        uVar20 = OVar27._0_8_;
                        uVar8 = OVar27.i;
                        pOVar24 = local_950;
                        if ((0xfffffff6 < uVar8 - 10) && (0xfffffff6 < uVar11 - 10)) {
                          uVar17 = uVar20 >> 0x20;
                          uVar18 = (ulong)uVar8;
                          if (local_7c8[uVar18 * 0x16 + uVar17 * 0xb + (ulong)uVar11] == 0) {
                            local_7c8[uVar18 * 0x16 + uVar17 * 0xb + (ulong)uVar11] =
                                 (long)local_958;
                            if ((int)local_908 == 0) {
                              local_910 = CONCAT44(local_910._4_4_,uVar8);
                            }
                            else if ((uint)local_948 <= uVar8) {
                              if ((uint)local_910 <= uVar8) {
                                local_910._0_4_ = uVar8;
                              }
                              uVar20 = local_948;
                            }
                            local_948 = uVar20;
                            local_848[uVar18 * 2 + uVar17] = local_848[uVar18 * 2 + uVar17] + 1;
                            if (uVar17 == 0) {
                              if (local_914 < 2) {
                                local_7e8[(ulong)local_914 + 2] = local_958;
                              }
                              local_914 = local_914 + 1;
                            }
                            else if (OVar27.j == 1) {
                              if (local_918 < 2) {
                                local_7e8[local_918] = local_958;
                              }
                              local_918 = local_918 + 1;
                            }
                            local_908 = CONCAT44(local_908._4_4_,(int)local_908 + 1);
                            if (MVar1 - 1 < 4) {
                              this_00 = &local_878;
                              switch((uint)MVar1) {
                              case 1:
                                this_00 = &local_860;
                                break;
                              case 3:
                                this_00 = &local_890;
                                break;
                              case 4:
                                this_00 = &local_8a8;
                              }
                              ON_SimpleArray<const_ON_Font_*>::Append(this_00,&local_958);
                              pOVar24 = local_950;
                            }
                          }
                        }
                      }
                    }
                    else {
                      iVar22 = iVar22 + 1;
                    }
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar25 != uVar23);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != (uint)local_940);
            uVar23 = local_8f0;
            uVar15 = local_8dc;
            if ((int)local_908 != 0) {
              local_938[2] = (ON_Font *)0x0;
              local_938[3] = (ON_Font *)0x0;
              local_938[0] = (ON_Font *)0x0;
              local_938[1] = (ON_Font *)0x0;
              if (((int)local_908 ==
                   local_890.m_count + local_8a8.m_count + local_878.m_count + local_860.m_count) &&
                 ((uint)(local_890.m_count | local_8a8.m_count |
                        local_878.m_count | local_860.m_count) < 2)) {
                if (local_860.m_count == 1) {
                  local_938[0] = *local_860.m_a;
                }
                else {
                  local_938[0] = (ON_Font *)0x0;
                }
                if (local_878.m_count == 1) {
                  local_938[1] = *local_878.m_a;
                }
                else {
                  local_938[1] = (ON_Font *)0x0;
                }
                if (local_890.m_count == 1) {
                  local_938[2] = *local_890.m_a;
                }
                else {
                  local_938[2] = (ON_Font *)0x0;
                }
                if (local_8a8.m_count == 1) {
                  local_938[3] = *local_8a8.m_a;
                }
                else {
                  local_938[3] = (ON_Font *)0x0;
                }
              }
              else {
                uVar8 = (uint)local_948;
                if ((local_914 < 3) &&
                   ((((int)local_908 == local_914 + local_918 && (local_918 < 3)) &&
                    (uVar8 == (uint)local_910)))) {
                  local_938[0] = local_7e8[2];
                  local_938[1] = local_7e8[3];
                  local_938[2] = local_7e8[0];
                  local_938[3] = local_7e8[1];
                }
                else {
                  if (uVar8 < (uint)local_910) {
                    uVar20 = 5;
                    lVar6 = 6;
                    lVar19 = 4;
                    do {
                      if (lVar19 != 0) {
                        uVar8 = (uint)lVar19;
                        if (local_848[lVar19 * 2 + 1] + local_848[lVar19 * 2] <=
                            local_848[uVar20 * 2 + 1] + local_848[uVar20 * 2]) {
                          uVar8 = (uint)uVar20;
                        }
                        uVar20 = (ulong)uVar8;
                      }
                      bVar5 = lVar19 != 0;
                      lVar19 = lVar19 + -1;
                      if (bVar5) {
                        uVar8 = (uint)lVar6;
                        if (local_848[lVar6 * 2 + 1] + local_848[lVar6 * 2] <=
                            local_848[uVar20 * 2 + 1] + local_848[uVar20 * 2]) {
                          uVar8 = (uint)uVar20;
                        }
                        uVar20 = (ulong)uVar8;
                      }
                      uVar8 = (uint)uVar20;
                      lVar6 = lVar6 + 1;
                    } while (lVar19 != -1);
                  }
                  if ((uVar8 - 10 < 0xfffffff7) ||
                     (uVar20 = (ulong)uVar8, local_848[uVar20 * 2] + local_848[uVar20 * 2 + 1] == 0)
                     ) goto LAB_0048393e;
                  local_910 = uVar20 * 0xb0;
                  plVar12 = local_7c8 + uVar20 * 0x16;
                  lVar6 = 0;
                  do {
                    if (local_848[uVar20 * 2 + lVar6] < 3) {
                      iVar9 = 0;
                      uVar23 = 1;
                      do {
                        if ((ON_Font *)plVar12[uVar23] != (ON_Font *)0x0) {
                          lVar19 = (long)iVar9;
                          iVar9 = iVar9 + 1;
                          local_938[lVar6 * 2 + lVar19] = (ON_Font *)plVar12[uVar23];
                        }
                      } while ((uVar23 < 9) && (uVar23 = uVar23 + 1, iVar9 < 2));
                    }
                    else {
                      bVar5 = *(long *)((long)alStack_7a8 + lVar6 * 0x58 + local_910) == 0;
                      lVar19 = lVar6 * 0x58 + local_910;
                      lVar4 = lVar19 + -0x7c8;
                      uVar23 = (ulong)(bVar5 + 4);
                      uVar15 = bVar5 + 3;
                      do {
                        uVar8 = uVar15;
                        uVar17 = uVar23;
                        lVar2 = *(long *)((long)local_7c8 +
                                         (uVar17 & 0xffffffff) * 8 + lVar4 + 0x7c8);
                        if ((int)uVar17 == 0) break;
                        uVar23 = uVar17 - 1;
                        uVar15 = uVar8 - 1;
                      } while (lVar2 == 0);
                      local_908 = uVar17 + 1;
                      if (*(long *)((long)alStack_7a8 + lVar19 + 0x18) != 0) {
                        local_908 = 7;
                      }
                      uVar23 = local_908 - 1;
                      lVar19 = -1;
                      iVar9 = 0;
                      do {
                        iVar16 = iVar9;
                        lVar21 = lVar19;
                        lVar3 = plVar12[uVar23 + 1];
                        uVar23 = uVar23 + 1;
                        if (9 < uVar23) break;
                        lVar19 = lVar21 + 1;
                        iVar9 = iVar16 + -1;
                      } while (lVar3 == 0);
                      if ((lVar2 == 0) || (lVar3 != 0)) {
                        if ((lVar2 == 0) && ((uVar23 != 0 && (lVar3 != 0)))) {
                          do {
                            uVar18 = local_908 + lVar21;
                            if ((int)uVar18 == 0) goto LAB_004834ce;
                            lVar21 = lVar21 + -1;
                            iVar16 = iVar16 + 1;
                          } while (*(long *)((long)local_7c8 +
                                            (uVar18 & 0xffffffff) * 8 + lVar4 + 0x7c8) == 0);
                          uVar17 = (ulong)(uint)((int)local_908 - iVar16);
                        }
                      }
                      else if ((int)uVar17 == 0) {
                        uVar17 = 0;
                      }
                      else {
                        do {
                          uVar18 = (ulong)uVar8;
                          bVar5 = uVar8 == 0;
                          uVar8 = uVar8 - 1;
                          if (bVar5) goto LAB_004834ce;
                        } while (*(long *)((long)local_7c8 + uVar18 * 8 + lVar4 + 0x7c8) == 0);
                        uVar23 = uVar17 & 0xffffffff;
                        uVar17 = uVar18;
                      }
LAB_004834ce:
                      local_938[lVar6 * 2] =
                           *(ON_Font **)
                            ((long)local_7c8 + (uVar17 & 0xffffffff) * 8 + lVar4 + 0x7c8);
                      local_938[lVar6 * 2 + 1] =
                           *(ON_Font **)
                            ((long)local_7c8 + (uVar23 & 0xffffffff) * 8 + lVar4 + 0x7c8);
                      pOVar24 = local_950;
                      local_940 = lVar6;
                    }
                    plVar12 = plVar12 + 0xb;
                    bVar5 = lVar6 == 0;
                    lVar6 = lVar6 + 1;
                    local_948 = uVar20;
                  } while (bVar5);
                }
              }
              if (local_938[1] == (ON_Font *)0x0 && local_938[0] == (ON_Font *)0x0) {
                local_938[0] = local_938[2];
                local_938[1] = local_938[3];
                local_938[2] = (ON_Font *)0x0;
                local_938[3] = (ON_Font *)0x0;
              }
              if (local_938[2] == (ON_Font *)0x0 && local_938[0] == (ON_Font *)0x0) {
                local_938[0] = local_938[1];
                local_938[2] = local_938[3];
                local_938[1] = (ON_Font *)0x0;
                local_938[3] = (ON_Font *)0x0;
              }
              puVar7 = &DAT_006c8f88;
              ppOVar10 = local_938;
              lVar6 = 0;
              do {
                lVar19 = 0;
                do {
                  pOVar14 = ppOVar10[lVar19];
                  if (pOVar14 != (ON_Font *)0x0) {
                    if ((pOVar14->m_quartet_member == Unset) ||
                       ((pOVar14->m_quartet_member != puVar7[lVar19] &&
                        (pOVar14->m_font_type != InstalledFont)))) {
                      pOVar14->m_quartet_member = puVar7[lVar19];
                    }
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 == 1);
                ppOVar10 = ppOVar10 + 2;
                puVar7 = puVar7 + 2;
                bVar5 = lVar6 == 0;
                lVar6 = lVar6 + 1;
              } while (bVar5);
              uVar23 = uVar26;
              if ((uint)local_900 < (uint)local_8f0) {
                do {
                  pOVar14 = (pOVar24->m_by_quartet_name).m_a[uVar23];
                  if ((((pOVar14 != (ON_Font *)0x0) && (pOVar14 != local_938[0])) &&
                      (pOVar14 != local_938[1])) &&
                     ((((pOVar14 != local_938[2] && (pOVar14 != local_938[3])) &&
                       ((pOVar14->m_font_bUnderlined == false &&
                        ((pOVar14->m_font_bStrikethrough == false &&
                         (pOVar14->m_quartet_member != Unset)))))) &&
                      (pOVar14->m_font_type == InstalledFont)))) {
                    pOVar14->m_quartet_member = Unset;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar25 != uVar23);
              }
              if ((iVar22 != 0) && ((uint)local_900 < (uint)local_8f0)) {
                do {
                  local_958 = (pOVar24->m_by_quartet_name).m_a[uVar26];
                  if ((local_958 != (ON_Font *)0x0) &&
                     ((local_958->m_font_bUnderlined != false ||
                      (local_958->m_font_bStrikethrough == true)))) {
                    OVar27 = Internal_StretchSlantWeightDex(10,10,local_958);
                    if ((OVar27.k - 1 < 9 && OVar27.i - 1 < 9) && OVar27._0_8_ >> 0x21 == 0) {
                      lVar6 = local_7c8[(OVar27._0_8_ & 0xffffffff) * 0x16 + (ulong)OVar27.k * 0xc];
                    }
                    else {
                      lVar6 = 0;
                    }
                    if (lVar6 != 0) {
                      local_958->m_quartet_member = *(Member *)(lVar6 + 0x91);
                    }
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar25 != uVar26);
              }
              ppOVar10 = local_938;
              lVar6 = 0;
              do {
                lVar19 = 0;
                do {
                  local_958 = ppOVar10[lVar19];
                  if ((((((local_958 != (ON_Font *)0x0) && (local_958->m_font_type != InstalledFont)
                         ) && (((uint)local_958->m_managed_installed_font_and_bits & 3) != 2 &&
                               local_958->m_runtime_serial_number != 0)) &&
                       ((local_958->m_font_bUnderlined == false &&
                        (local_958->m_font_bStrikethrough == false)))) &&
                      (pOVar14 = (ON_Font *)
                                 (local_958->m_managed_installed_font_and_bits & 0xfffffffffffffffc)
                      , pOVar14 != (ON_Font *)0x0)) &&
                     ((pOVar14->m_font_type == InstalledFont ||
                      (((pOVar14->m_font_type == ManagedFont &&
                        (pOVar14->m_runtime_serial_number != 0)) &&
                       (((uint)pOVar14->m_managed_installed_font_and_bits & 3) == 1)))))) {
                    pOVar13 = &pOVar14->m_loc_windows_logfont_name;
                    bVar5 = ON_wString::IsNotEmpty(pOVar13);
                    if (!bVar5) {
                      pOVar13 = &pOVar14->m_en_windows_logfont_name;
                    }
                    ON_wString::ON_wString(&local_8d8.m_quartet_name,pOVar13);
                    bVar5 = ON_wString::EqualOrdinal(&local_8f8,&local_8d8.m_quartet_name,true);
                    ON_wString::~ON_wString(&local_8d8.m_quartet_name);
                    if (bVar5) {
                      ON_Font::InstalledFontQuartet(&local_8d8,pOVar14);
                      ON_wString::ON_wString(&local_7f0,&local_8d8.m_quartet_name);
                      bVar5 = ON_wString::EqualOrdinal(&local_8f8,&local_7f0,true);
                      ON_wString::~ON_wString(&local_7f0);
                      if (bVar5) {
                        if (local_8d8.m_regular != (ON_Font *)0x0) {
                          local_938[0] = local_8d8.m_regular;
                        }
                        if (local_8d8.m_bold != (ON_Font *)0x0) {
                          local_938[1] = local_8d8.m_bold;
                        }
                        if (local_8d8.m_italic != (ON_Font *)0x0) {
                          local_938[2] = local_8d8.m_italic;
                        }
                        if (local_8d8.m_bold_italic != (ON_Font *)0x0) {
                          local_938[3] = local_8d8.m_bold_italic;
                        }
                      }
                      ON_wString::~ON_wString(&local_8d8.m_quartet_name);
                    }
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 == 1);
                ppOVar10 = ppOVar10 + 2;
                bVar5 = lVar6 == 0;
                lVar6 = lVar6 + 1;
              } while (bVar5);
              quartet_name_00 = ON_wString::operator_cast_to_wchar_t_(&local_8f8);
              ON_FontFaceQuartet::ON_FontFaceQuartet
                        (&local_8d8,quartet_name_00,local_938[0],local_938[1],local_938[2],
                         local_938[3]);
              pOVar24 = local_950;
              if ((((local_8d8.m_regular != (ON_Font *)0x0) || (local_8d8.m_bold != (ON_Font *)0x0))
                  || (local_8d8.m_italic != (ON_Font *)0x0)) ||
                 (local_8d8.m_bold_italic != (ON_Font *)0x0)) {
                ON_ClassArray<ON_FontFaceQuartet>::Append(local_8e8,&local_8d8);
              }
              ON_wString::~ON_wString(&local_8d8.m_quartet_name);
              uVar23 = local_8f0;
              uVar15 = local_8dc;
            }
          }
LAB_0048393e:
          ON_wString::~ON_wString(&local_8f8);
          uVar25 = local_900;
        }
        uVar8 = (uint)uVar25 + 1;
        if ((uint)uVar25 < (uint)uVar23) {
          uVar8 = (uint)uVar23;
        }
        uVar25 = (ulong)uVar8;
      } while (uVar8 < uVar15);
    }
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray(&local_8a8);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray(&local_890);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray(&local_878);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray(&local_860);
  }
  return local_8e8;
}

Assistant:

const ON_ClassArray< ON_FontFaceQuartet >& ON_FontList::QuartetList() const
{
  // call ByQuartetName() first to insure m_quartet_list[] is set correctly.
  const ON_SimpleArray<const ON_Font*>& a = this->ByQuartetName();
  
  if (m_quartet_list.Count() > 0)
    return m_quartet_list;

  const unsigned int font_count = a.UnsignedCount();
  m_quartet_list.Reserve(32 + font_count / 4);

  const ON_Font* f = nullptr;
  const unsigned max_stretch_dex = 10;
  const unsigned max_weight_dex = 10;

  // fonts_by_ssw[stretch_dex][upright,italic][weight_dex]
  // = all fonts with the same quartet name arranged by stretch, slant, and weight.
  const ON_Font* fonts_by_ssw[11][2][11] = {};

  // weight_count[stretch_dex][upright,italic] = number of weights available for that stretch and slant
  unsigned int weight_count[10][2] = {};

  // stretch values range from min stretch = stretch_dex_range[0] to max stretch = stretch_dex_range[1].
  unsigned stretch_dex_range[2] = { 0U,0U };

  // Fonts with stretch < medium_stretch_dex are "compressed"
  // Fonts with stretch > medium_stretch_dex are "expanded"
  // When we have multiple candidates to choose from, we opt for ones closest to medium.
  const unsigned medium_stretch_dex = (unsigned)static_cast<unsigned char>(ON_Font::Stretch::Medium);

  ON_SimpleArray<const ON_Font*> regular_faces(8);
  ON_SimpleArray<const ON_Font*> bold_faces(8);
  ON_SimpleArray<const ON_Font*> italic_faces(8);
  ON_SimpleArray<const ON_Font*> bolditalic_faces(8);

  unsigned next_i = 0U;
  for (unsigned i = 0; i < font_count; i = (i < next_i) ? next_i : (i+1))
  {
    f = a[i];
    if (nullptr == f)
      continue;

    const ON_wString quartet_name = f->QuartetName();
    if (quartet_name.IsEmpty())
      continue;

    // fonts_by_ssw_count = total number of undecorated fonts with the same QuartetName()
    unsigned fonts_by_ssw_count = 0;

    // total number of fonts with underline or striketrough rendering effects enabled.
    unsigned decorated_fonts_count = 0;

    // fonts_by_ssw[][][] = all the "clean" fonts with the same quartet name sorted by stretch-slant-weight
    memset(fonts_by_ssw, 0, sizeof(fonts_by_ssw));
    memset(weight_count, 0, sizeof(weight_count));
    memset(stretch_dex_range, 0, sizeof(stretch_dex_range));
    regular_faces.SetCount(0);
    bold_faces.SetCount(0);
    italic_faces.SetCount(0);
    bolditalic_faces.SetCount(0);

    unsigned int upright_face_count = 0;
    unsigned int slanted_face_count = 0;
    const ON_Font* upright_faces[2] = {}; // room to save up to 2 upright faces
    const ON_Font* slanted_faces[2] = {}; // room to save up to 2 slanted faces

    // This for() loop sets the array limits for the fonts with the same quartet name
    // and determines how many passes are needed (substitutes are ignored in favor of
    // non substitutes).
    unsigned pass_count = 1;
    for (next_i = i; next_i < font_count; ++next_i)
    {
      f = a[next_i];
      if (nullptr == f)
        break;
      if (false == quartet_name.EqualOrdinal(f->QuartetName(), true))
        break; // f has a different quartet name - we're done getting the fonts in this quartet
      if (f->IsManagedSubstitutedFont())
        pass_count = 2;
    }
    
    // This for() loop gets all the fonts with the same QuartetName() and puts them in fonts_by_ssw[][][]. 
    // While doing that it get ranges of values stretch, counts the number of fonts that have each weight, ...
    for ( unsigned pass = 0; pass < pass_count; ++pass) for ( unsigned j = i; j < next_i; ++j)
    {
      f = a[j];
      if (nullptr == f)
        continue;
      if (f->IsUnderlined() || f->IsStrikethrough())
      {
        // these are rendering effects and we should have a "clean" version in this list too
        ++decorated_fonts_count;
        continue; 
      }
      if (pass != (f->IsManagedSubstitutedFont() ? 1U : 0U))
        continue;

      const ON_FontFaceQuartet::Member fm = f->m_quartet_member;

      // use f's stretch-slant-weight to add it to the fonts_by_ssw[][][] array.
      const ON_3udex ssw_dex = Internal_StretchSlantWeightDex(max_stretch_dex, max_weight_dex, f);

      const unsigned stretch_dex = ssw_dex.i;
      if (stretch_dex < 1 || stretch_dex >= max_stretch_dex)
        continue;

      const unsigned slant_dex = ssw_dex.j;

      const unsigned weight_dex = ssw_dex.k;
      if (weight_dex < 1 || weight_dex >= max_weight_dex)
        continue;

      if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][weight_dex])
      {
        // We already found one font with he same quartet name, stretch, slant, and weight.
        // The first one wins and that's why we use two passes when substitute fonts are involved.
        continue;
      }

      ++fonts_by_ssw_count;
      fonts_by_ssw[stretch_dex][slant_dex][weight_dex] = f;

      // add this font's stretch, weight, and slant to the tally for this quartet name.
      if (1 == fonts_by_ssw_count)
      {
        stretch_dex_range[0] = stretch_dex;
        stretch_dex_range[1] = stretch_dex;
      }
      else if (stretch_dex < stretch_dex_range[0])
        stretch_dex_range[0] = stretch_dex;
      else if (stretch_dex > stretch_dex_range[1])
        stretch_dex_range[1] = stretch_dex;

      ++weight_count[stretch_dex][slant_dex];

      if (0 == slant_dex)
      {
        if (upright_face_count < 2)
          upright_faces[upright_face_count] = f;
        ++upright_face_count;
      }
      else if (1 == slant_dex)
      {
        if (slanted_face_count < 2)
          slanted_faces[slanted_face_count] = f;
        ++slanted_face_count;
      }

      // if f's role in the quartet is known, add it to the appropriate x_faces[] array.
      switch (fm)
      {
      case ON_FontFaceQuartet::Member::Regular:
        regular_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Bold:
        bold_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Italic:
        italic_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::BoldItalic:
        bolditalic_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Unset:
        break;
      };
    }

    // fonts_by_ssw_count = number of usable fonts with the same quartet name.
    // Pointers to these fonts are someplace in the fonts_by_ssw[][][] array.
    if (0 == fonts_by_ssw_count)
      continue; // nothing usable

    // The goal is to look at the fonts in fonts_by_ssw[][][] and select
    // the best choice for a rich text quartet (which may have 1 to 4 faces).
    const ON_Font* quartet_faces[2][2] = {};
    bool bHaveQuartetFaces = false;

    const unsigned regular_count = regular_faces.UnsignedCount();
    const unsigned bold_count = bold_faces.UnsignedCount();
    const unsigned italic_count = italic_faces.UnsignedCount();
    const unsigned bolditalic_count = bolditalic_faces.UnsignedCount();
    if (
      fonts_by_ssw_count == (regular_count + bold_count + italic_count + bolditalic_count)
      && regular_count <= 1 && bold_count <= 1 && italic_count <= 1 && bolditalic_count <= 1)
    {
      // Best case - every font with this quartet name knows the role it plays in the quartet and there are no contradictions.
      quartet_faces[0][0] = 1 == regular_count ? regular_faces[0] : nullptr;
      quartet_faces[0][1] = 1 == bold_count ? bold_faces[0] : nullptr;
      quartet_faces[1][0] = 1 == italic_count ? italic_faces[0] : nullptr;
      quartet_faces[1][1] = 1 == bolditalic_count ? bolditalic_faces[0] : nullptr;
      bHaveQuartetFaces = true;
    }
    else if (fonts_by_ssw_count == upright_face_count + slanted_face_count
      && upright_face_count <= 2
      && slanted_face_count <= 2
      && stretch_dex_range[0] == stretch_dex_range[1]
      )
    {
      if (2 == upright_face_count && ON_Font::CompareWeight(upright_faces[0]->FontWeight(), upright_faces[1]->FontWeight()) > 0)
      {
        f = upright_faces[0];
        upright_faces[0] = upright_faces[1];
        upright_faces[1] = f;
      }
      if (2 == slanted_face_count && ON_Font::CompareWeight(slanted_faces[0]->FontWeight(), slanted_faces[1]->FontWeight()) > 0)
      {
        f = slanted_faces[0];
        slanted_faces[0] = slanted_faces[1];
        slanted_faces[1] = f;
      }
      quartet_faces[0][0] = upright_faces[0];
      quartet_faces[0][1] = upright_faces[1];
      quartet_faces[1][0] = slanted_faces[0];
      quartet_faces[1][1] = slanted_faces[1];
      bHaveQuartetFaces = true;
    }

    if (false == bHaveQuartetFaces)
    {
      // 1. Most Windows installed fonts have the Windows LOGFONT name reliably set
      // from Windows LOGFONT information when we create installed ON_Fonts from 
      // DirectWrite fonts in opennurbs_win_dwrite.cpp. The Windows LOGFONTs partition
      // families into quartets. These end up with bUsePairCandidate = true.
      // 
      // 2. In rare cases on Windows, font foundaries or authors fail to specify a LOGFONT name
      // in the ttc / ttf / postscript / ... file. 
      // If we are able to make a reasonable guess, then we set the member here.
      // 
      // 3. Apple installed fonts are created from CTFont in opennurbs_apple_nsfont.cpp
      // and the LOGFONT information from ttc / ttf / postscript files cannot be retrieved.
      // There are no Mac OS tools that reliably paritition large font families into
      // quartets.
      // 
      // 4. Missing fonts that are created in ON_Font::FontFromRichTextProperties() have the quartet
      // member set to the specified rich text regular/bold/italic/bold-italic property.
      //
      // Attempt to find something usable in this mess ...

      unsigned stretch_dex = medium_stretch_dex;
      if (stretch_dex_range[0] < stretch_dex_range[1])
      {
        // Need to pick the stretch_dex with the most members.
        // This happens on Mac OS (where no reliable "LOGFONT" name exists) and
        // with damaged Windows fonts that don't have a "LOFGONT" name set.
        // Pick the one closest to ON_Font::Stretch::Medium with the most faces        
        for (unsigned k = 1; k <= medium_stretch_dex; ++k)
        {
          const unsigned k0 = medium_stretch_dex - k;
          const unsigned k1 = medium_stretch_dex + k;
          if (k0 > 0 && (weight_count[k0][0] + weight_count[k0][1]) > (weight_count[stretch_dex][0] + weight_count[stretch_dex][1]))
            stretch_dex = k0;
          if (k1 < max_stretch_dex && (weight_count[k1][0] + weight_count[k1][1]) >(weight_count[stretch_dex][0] + weight_count[stretch_dex][1]))
            stretch_dex = k1;
        }
      }
      else
      {
        stretch_dex = stretch_dex_range[0];
      }
      if (stretch_dex < 1 || stretch_dex >= max_stretch_dex)
        continue;

      if (weight_count[stretch_dex][0] + weight_count[stretch_dex][1] <= 0)
        continue;

      const unsigned normal_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Normal);
      const unsigned medium_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Medium);
      const unsigned bold_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Bold);

      for (unsigned slant_dex = 0; slant_dex < 2; slant_dex++)
      {
        if (weight_count[stretch_dex][slant_dex] <= 2)
        {
          // 0, 1 or 2 available weights.
          // If there is 1 face it must be the "Regular" face.
          // If there are 2 faces, the lightest will be "Regular" and the heaviest will be bold.
          int pair_dex = 0;
          for (int j = 1; j < max_weight_dex && pair_dex < 2; ++j)
          {
            if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][j])
              quartet_faces[slant_dex][pair_dex++] = fonts_by_ssw[stretch_dex][slant_dex][j];
          }
          continue;
        }

        // 3 or more available weights (Bahnshrift, Helvetica Neue, ...)
        unsigned regular_dex
          = (nullptr != fonts_by_ssw[stretch_dex][slant_dex][normal_weight_dex])
          ? normal_weight_dex
          : medium_weight_dex;
        while (nullptr == fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && regular_dex > 0)
          --regular_dex;

        unsigned bold_dex
          = (nullptr != fonts_by_ssw[stretch_dex][slant_dex][bold_weight_dex])
          ? bold_weight_dex
          : regular_dex + 1;
        while (nullptr == fonts_by_ssw[stretch_dex][slant_dex][bold_dex] && bold_dex < max_weight_dex)
          ++bold_dex;

        if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && nullptr == fonts_by_ssw[stretch_dex][slant_dex][bold_dex])
        {
          if (regular_dex > 0)
          {
            for (unsigned j = regular_dex - 1; j > 0; --j)
            {
              if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][j])
                continue;
              bold_dex = regular_dex;
              regular_dex = j;
              break;
            }
          }
        }
        else if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && nullptr != fonts_by_ssw[stretch_dex][slant_dex][bold_dex])
        {
          if (bold_dex > 0)
          {
            for (unsigned j = bold_dex - 1; j > 0; --j)
            {
              if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][j])
                continue;
              regular_dex = j;
              break;
            }
          }
        }

        quartet_faces[slant_dex][0] = fonts_by_ssw[stretch_dex][slant_dex][regular_dex];
        quartet_faces[slant_dex][1] = fonts_by_ssw[stretch_dex][slant_dex][bold_dex];
      }
    }

    if (nullptr == quartet_faces[0][0] && nullptr == quartet_faces[0][1])
    {
      // Fonts like Monotype Corsiva have only slanted faces.
      // A quartet name + regular/bold/italic/italic-bold user interface should offer
      // a regular and bold member in this situation.
      quartet_faces[0][0] = quartet_faces[1][0];
      quartet_faces[0][1] = quartet_faces[1][1];
      quartet_faces[1][0] = nullptr;
      quartet_faces[1][1] = nullptr;
    }

    if (nullptr == quartet_faces[0][0] && nullptr == quartet_faces[1][0])
    {
      // This might happen if buggy code encounters a heavy font like Arial Black
      // and incorrectly specifies the heavy regular/italic faces as bold.
      // A quartet name + regular/bold/italic/italic-bold user interface should offer
      // a regular and italic member in this situation.
      quartet_faces[0][0] = quartet_faces[0][1];
      quartet_faces[1][0] = quartet_faces[1][1];
      quartet_faces[0][1] = nullptr;
      quartet_faces[1][1] = nullptr;
    }

    // If ON_Font.m_quartet_member is not set or set incorrectly, 
    // then set it now so we get consistent answers going forward.
    // (Managed quartets are recomputed as new missing fonts are added and in complex cases, the quartet member can change).
    // Installed font quartet members are set once and never change.
    const ON_FontFaceQuartet::Member member[2][2] = {
      {ON_FontFaceQuartet::Member::Regular,ON_FontFaceQuartet::Member::Bold},
      {ON_FontFaceQuartet::Member::Italic,ON_FontFaceQuartet::Member::BoldItalic}
    };
    for (int ii = 0; ii < 2; ++ii) for (int jj = 0; jj < 2; ++jj)
    {
      f = quartet_faces[ii][jj];
      if (nullptr != f)
      {
        const ON_FontFaceQuartet::Member m = f->m_quartet_member;
        if (ON_FontFaceQuartet::Member::Unset == m)
          f->m_quartet_member = member[ii][jj];
        else if (m != member[ii][jj])
        {
          if (ON_Font::FontType::InstalledFont != f->m_font_type)
            quartet_faces[ii][jj]->m_quartet_member = member[ii][jj];
        }
      }
    }

    // Unset the m_quartet_member on unsed fonts with this quartet name.
    for (unsigned j = i; j < next_i; ++j)
    {
      f = a[j];
      if (nullptr == f)
        continue;
      if (f == quartet_faces[0][0] || f == quartet_faces[0][1] || f == quartet_faces[1][0] || f == quartet_faces[1][1])
        continue;
      if (f->IsUnderlined() || f->IsStrikethrough())
        continue; // dealt with below

      const ON_FontFaceQuartet::Member fm = f->m_quartet_member;
      if (ON_FontFaceQuartet::Member::Unset == fm)
        continue;
      if (ON_Font::FontType::InstalledFont != f->m_font_type)
        continue;

      // m_quartet_member incorrectly set. 
      // If you are debugging and this is causing a problem, the bug is not here; 
      // it is in the code above that fills in quartet_faces[][].
      f->m_quartet_member = ON_FontFaceQuartet::Member::Unset;
    }

    if (decorated_fonts_count > 0)
    {
      // This for() loop copies the clean font quartet settings to decorated  (underlined and strikethrough) fonts
      for (unsigned j = i; j < next_i; ++j)
      {
        f = a[j];
        if (nullptr == f)
          continue;
        if (false == f->IsUnderlined() && false == f->IsStrikethrough())
          continue;

        // f is underlined or strikethrough - find the clean version in fonts_by_ssw[][][]
        const ON_3udex ssw_dex = Internal_StretchSlantWeightDex(max_stretch_dex, max_weight_dex, f);
        const ON_Font* cleanf = (
          ssw_dex.i >= 1 && ssw_dex.i < max_stretch_dex
          && ssw_dex.j >= 0 && ssw_dex.j < 2
          && ssw_dex.k >= 1 && ssw_dex.k < max_weight_dex
          )
          ? fonts_by_ssw[ssw_dex.i][ssw_dex.k][ssw_dex.k]
          : nullptr;
        if (nullptr != cleanf)
        {
          const ON_FontFaceQuartet::Member fm = cleanf->m_quartet_member;
          f->m_quartet_member = fm;
        }
      }
    }

    // Now convert managed to installed when that makes sense.
    for (int ii = 0; ii < 2; ++ii) for (int jj = 0; jj < 2; ++jj)
    {
      f = quartet_faces[ii][jj];
      if (nullptr == f)
        continue;
      if (ON_Font::FontType::InstalledFont == f->m_font_type)
        continue;
      if (f->IsManagedSubstitutedFont())
        continue; // common - f is a managed font that is missing from this device.

      if (false == f->IsManagedFont())
        continue; // troubling situation ...
      if (f->IsUnderlined() || f->IsStrikethrough())
        continue; // troubling situation ... 

      // There are 2 lists of fonts.
      // All installed fonts - this list is made once when an application starts.
      // Managed fonts - this list grows as an application needs fonts
      // and is used to handle missing fonts and fonts with effects like underlined and strikethrough.
      // 
      // This is a case where a managed font, like ON_Font::Default, 
      // the default engraving font, 
      // and more complicated cases that arise is rich text parsing, 
      // has an identical font that is installed.
      const ON_Font* installed_font = f->Internal_ManagedFontToInstalledFont();
      if (nullptr == installed_font)
        continue;
      if (false == installed_font->IsInstalledFont())
        continue; // bad mojo happened sometime earlier in the life of this app instance.
      if (false == quartet_name.EqualOrdinal(installed_font->QuartetName(), true))
        continue; // troubling situation ...

      // It is often the case that the installed quartet has faces not in the managed font list.
      // ON_Font::Default is a good example. 
      // If there 
      ON_FontFaceQuartet installed_font_quartet = installed_font->InstalledFontQuartet();
      if (false == quartet_name.EqualOrdinal(installed_font_quartet.QuartetName(), true))
        continue;

      if (installed_font_quartet.HasRegularFace())
        quartet_faces[0][0] = installed_font_quartet.RegularFace();
      if (installed_font_quartet.HasBoldFace())
        quartet_faces[0][1] = installed_font_quartet.BoldFace();
      if (installed_font_quartet.HasItalicFace())
        quartet_faces[1][0] = installed_font_quartet.ItalicFace();
      if (installed_font_quartet.HasBoldItalicFace())
        quartet_faces[1][1] = installed_font_quartet.BoldItalicFace();
    }

    const ON_FontFaceQuartet q(quartet_name, quartet_faces[0][0], quartet_faces[0][1], quartet_faces[1][0], quartet_faces[1][1]);
    if (q.IsEmpty())
      continue;

    m_quartet_list.Append(q);
  }

  return m_quartet_list;
}